

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O0

int SoapSendAction(char *action_url,char *service_type,IXML_Document *action_node,
                  IXML_Document **response_node)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *action;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 in_stack_fffffffffffffba0;
  undefined4 uVar7;
  size_t action_str_len;
  size_t xml_end_len;
  size_t xml_start_len;
  char *xml_end;
  char *xml_start;
  off_t content_length;
  int got_response;
  char *upnp_error_str;
  undefined1 local_370 [4];
  int upnp_error_code;
  uri_type url;
  http_parser_t response;
  int ret_code;
  int err_code;
  membuffer responsename;
  membuffer request;
  memptr name;
  char *action_str;
  IXML_Document **response_node_local;
  IXML_Document *action_node_local;
  char *service_type_local;
  char *action_url_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffba0 >> 0x20);
  bVar1 = false;
  *response_node = (IXML_Document *)0x0;
  response.scanner._20_4_ = 0xffffff98;
  UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x228,"Inside SoapSendAction():");
  membuffer_init((membuffer *)&responsename.size_inc);
  membuffer_init((membuffer *)&ret_code);
  action = (char *)ixmlPrintNode(action_node);
  iVar3 = response.scanner._20_4_;
  if (action != (char *)0x0) {
    iVar2 = get_action_name(action,(memptr *)&request.size_inc);
    if (iVar2 == 0) {
      sVar4 = strlen(action_url);
      iVar2 = http_FixStrUrl(action_url,sVar4,(uri_type *)local_370);
      if (iVar2 == 0) {
        UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x241,"path=%.*s, hostport=%.*s\n",
                   (ulong)url.pathquery.buff & 0xffffffff,url._24_8_,
                   CONCAT44(uVar7,url.hostport.text.buff._0_4_),url.fragment.size);
        sVar4 = strlen(
                      "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\r\n<s:Body>"
                      );
        sVar5 = strlen("</s:Body>\r\n</s:Envelope>\r\n\r\n");
        sVar6 = strlen(action);
        request.capacity = 0x32;
        iVar2 = http_MakeMessage((membuffer *)&responsename.size_inc,1,1,"qNssssbscUcbbb",0xb,
                                 local_370,sVar4 + sVar6 + sVar5,ContentTypeHeader,"SOAPACTION: \"",
                                 service_type,"#",request.size_inc,name.buf,"\"",
                                 "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\r\n<s:Body>"
                                 ,sVar4,action,sVar6,"</s:Body>\r\n</s:Envelope>\r\n\r\n",sVar5);
        if (iVar2 == 0) {
          iVar3 = soap_request_and_response
                            ((membuffer *)&responsename.size_inc,(uri_type *)local_370,
                             (http_parser_t *)&url.hostport.IPaddress.__ss_align);
          bVar1 = true;
          if (((iVar3 == 0) &&
              (iVar2 = membuffer_append((membuffer *)&ret_code,(void *)request.size_inc,
                                        (size_t)name.buf), iVar3 = response.scanner._20_4_,
              iVar2 == 0)) &&
             (iVar2 = membuffer_append_str((membuffer *)&ret_code,"Response"), iVar2 == 0)) {
            iVar3 = get_response_value((http_message_t *)&url.hostport.IPaddress.__ss_align,1,
                                       _ret_code,(int *)((long)&upnp_error_str + 4),
                                       (IXML_Node **)response_node,(char **)&stack0xfffffffffffffc80
                                      );
            if (iVar3 == 1) {
              response.scanner._20_4_ = 0;
              iVar3 = response.scanner._20_4_;
            }
            else if (iVar3 == 3) {
              response.scanner._20_4_ = upnp_error_str._4_4_;
              iVar3 = response.scanner._20_4_;
            }
          }
        }
      }
      else {
        response.scanner._20_4_ = 0xffffff94;
        iVar3 = response.scanner._20_4_;
      }
    }
    else {
      response.scanner._20_4_ = 0xffffff8d;
      iVar3 = response.scanner._20_4_;
    }
  }
  response.scanner._20_4_ = iVar3;
  ixmlFreeDOMString(action);
  membuffer_destroy((membuffer *)&responsename.size_inc);
  membuffer_destroy((membuffer *)&ret_code);
  if (bVar1) {
    httpmsg_destroy((http_message_t *)&url.hostport.IPaddress.__ss_align);
  }
  return response.scanner._20_4_;
}

Assistant:

int SoapSendAction(char *action_url,
	char *service_type,
	IXML_Document *action_node,
	IXML_Document **response_node)
{
	char *action_str = NULL;
	memptr name;
	membuffer request;
	membuffer responsename;
	int err_code;
	int ret_code;
	http_parser_t response;
	uri_type url;
	int upnp_error_code;
	char *upnp_error_str;
	int got_response = 0;

	off_t content_length;
	const char *xml_start =
		"<s:Envelope "
		"xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/"
		"\">\r\n"
		"<s:Body>";
	const char *xml_end = "</s:Body>\r\n"
			      "</s:Envelope>\r\n\r\n";
	size_t xml_start_len;
	size_t xml_end_len;
	size_t action_str_len;

	*response_node = NULL; /* init */

	err_code = UPNP_E_OUTOF_MEMORY; /* default error */

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"Inside SoapSendAction():");
	/* init */
	membuffer_init(&request);
	membuffer_init(&responsename);

	/* print action */
	action_str = ixmlPrintNode((IXML_Node *)action_node);
	if (action_str == NULL) {
		goto error_handler;
	}
	/* get action name */
	if (get_action_name(action_str, &name) != 0) {
		err_code = UPNP_E_INVALID_ACTION;
		goto error_handler;
	}
	/* parse url */
	if (http_FixStrUrl(action_url, strlen(action_url), &url) != 0) {
		err_code = UPNP_E_INVALID_URL;
		goto error_handler;
	}

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"path=%.*s, hostport=%.*s\n",
		(int)url.pathquery.size,
		url.pathquery.buff,
		(int)url.hostport.text.size,
		url.hostport.text.buff);

	xml_start_len = strlen(xml_start);
	xml_end_len = strlen(xml_end);
	action_str_len = strlen(action_str);

	/* make request msg */
	request.size_inc = 50;
	content_length = (off_t)(xml_start_len + action_str_len + xml_end_len);
	if (http_MakeMessage(&request,
		    1,
		    1,
		    "q"
		    "N"
		    "s"
		    "sssbsc"
		    "Uc"
		    "b"
		    "b"
		    "b",
		    SOAPMETHOD_POST,
		    &url,
		    content_length,
		    ContentTypeHeader,
		    "SOAPACTION: \"",
		    service_type,
		    "#",
		    name.buf,
		    name.length,
		    "\"",
		    xml_start,
		    xml_start_len,
		    action_str,
		    action_str_len,
		    xml_end,
		    xml_end_len) != 0) {
		goto error_handler;
	}

	ret_code = soap_request_and_response(&request, &url, &response);
	got_response = 1;
	if (ret_code != UPNP_E_SUCCESS) {
		err_code = ret_code;
		goto error_handler;
	}

	if (membuffer_append(&responsename, name.buf, name.length) != 0 ||
		membuffer_append_str(&responsename, "Response") != 0) {
		goto error_handler;
	}
	/* get action node from the response */
	ret_code = get_response_value(&response.msg,
		SOAP_ACTION_RESP,
		responsename.buf,
		&upnp_error_code,
		(IXML_Node **)response_node,
		&upnp_error_str);

	if (ret_code == SOAP_ACTION_RESP) {
		err_code = UPNP_E_SUCCESS;
	} else if (ret_code == SOAP_ACTION_RESP_ERROR) {
		err_code = upnp_error_code;
	} else {
		err_code = ret_code;
	}

error_handler:
	ixmlFreeDOMString(action_str);
	membuffer_destroy(&request);
	membuffer_destroy(&responsename);
	if (got_response) {
		httpmsg_destroy(&response.msg);
	}

	return err_code;
}